

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgmcp(fitsfile *gfptr,fitsfile *mfptr,long member,int cpopt,int *status)

{
  int iVar1;
  char *comm;
  long value_00;
  int hdutype;
  int hdunum;
  int keypos;
  fitsfile *tmpfptr;
  int numkeys;
  char *incList [2];
  char extname [71];
  char comment [73];
  char value [81];
  char keyname [81];
  char card [81];
  int local_224;
  int local_220;
  int local_21c;
  fitsfile *local_218;
  long local_210;
  int local_208;
  int local_204;
  fitsfile *local_200;
  char *local_1f8;
  char *pcStack_1f0;
  ulong local_1e8 [10];
  char local_198 [80];
  char local_148 [96];
  char local_e8 [96];
  char local_88 [88];
  
  local_204 = 0;
  local_21c = 0;
  local_220 = 0;
  local_224 = 0;
  local_1f8 = "GRPID#";
  pcStack_1f0 = "GRPLC#";
  local_218 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  iVar1 = ffgmop(gfptr,member,&local_218,status);
  *status = iVar1;
  if (iVar1 == 0) {
    iVar1 = ffgkys(local_218,"EXTNAME",(char *)local_1e8,local_198,status);
    *status = iVar1;
    if (iVar1 != 0) {
      if (iVar1 != 0xca) goto LAB_001725e7;
      local_1e8[0] = local_1e8[0] & 0xffffffffffffff00;
      *status = 0;
    }
    prepare_keyvalue((char *)local_1e8);
    iVar1 = fits_strcasecmp((char *)local_1e8,"GROUPING");
    if (iVar1 == 0) {
      iVar1 = ffgtcp(local_218,mfptr,0,status);
      *status = iVar1;
    }
    else {
      local_210 = member;
      local_208 = cpopt;
      local_200 = gfptr;
      iVar1 = ffcopy(local_218,mfptr,0,status);
      *status = iVar1;
      ffgrec(mfptr,0,local_88,status);
      while (*status == 0) {
        iVar1 = ffgnxk(mfptr,&local_1f8,2,(char **)0x0,0,local_88,status);
        *status = iVar1;
        iVar1 = ffghps(mfptr,&local_204,&local_21c,status);
        *status = iVar1;
        iVar1 = ffgkyn(mfptr,local_21c + -1,local_e8,local_148,local_198,status);
        *status = iVar1;
        iVar1 = ffgrec(mfptr,local_21c + -1,local_88,status);
        *status = iVar1;
        iVar1 = ffdkey(mfptr,local_e8,status);
        *status = iVar1;
      }
      if (*status == 0xca) {
        *status = 0;
      }
      member = local_210;
      gfptr = local_200;
      cpopt = local_208;
      if (*status != 0) goto LAB_001725e7;
    }
    if ((char)local_1e8[0] == '\0') {
      iVar1 = ffghdn(local_218,&local_220);
      local_1e8[0] = 0x544c5541464544;
      if (iVar1 == 1) {
        local_1e8[0] = 0x5952414d495250;
      }
      comm = "default EXTNAME set by CFITSIO";
      if (iVar1 == 1) {
        comm = "HDU was Formerly a Primary Array";
      }
      iVar1 = ffpkys(mfptr,"EXTNAME",(char *)local_1e8,comm,status);
      *status = iVar1;
    }
    ffghdn(mfptr,&local_220);
    ffghdt(mfptr,&local_224,status);
    iVar1 = ffmkyj(mfptr,"EXTVER",0,(char *)0x0,status);
    *status = iVar1;
    if (iVar1 == 0xca) {
      *status = 0;
      iVar1 = ffgkys(mfptr,"EXTNAME",(char *)local_1e8,local_198,status);
      *status = iVar1;
      iVar1 = ffikyj(mfptr,"EXTVER",0,"Extension version ID",status);
      *status = iVar1;
    }
    if (*status == 0) {
      value_00 = 0;
      local_210 = member;
      do {
        value_00 = value_00 + 1;
        iVar1 = ffmnhd(mfptr,local_224,(char *)local_1e8,(int)value_00,status);
      } while (iVar1 == 0);
      *status = 0;
      ffmahd(mfptr,local_220,&local_224,status);
      iVar1 = ffmkyj(mfptr,"EXTVER",value_00,(char *)0x0,status);
      *status = iVar1;
      if (cpopt == 2) {
        iVar1 = ffgmrm(gfptr,local_210,1,status);
        *status = iVar1;
      }
      else {
        if (cpopt == 1) goto LAB_001725e7;
        if (cpopt != 0) {
          *status = 0x15b;
          ffpmsg("Invalid value specified for the cmopt parameter (ffgmcp)");
          goto LAB_001725e7;
        }
      }
      iVar1 = ffgtam(gfptr,mfptr,0,status);
      *status = iVar1;
    }
  }
LAB_001725e7:
  if (local_218 != (fitsfile *)0x0) {
    ffclos(local_218,status);
  }
  return *status;
}

Assistant:

int ffgmcp(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   fitsfile *mfptr,  /* FITS file pointer to new member
				FITS file                                    */
	   long      member, /* member ID (row num) within grouping table    */
	   int       cpopt,  /* code specifying copy options:
				OPT_MCP_ADD  (0) ==> add copied member to the
 				                     grouping table
				OPT_MCP_NADD (1) ==> do not add member copy to
				                     the grouping table
				OPT_MCP_REPL (2) ==> replace current member
				                     entry with member copy  */
	   int      *status) /* return status code                           */
	   
/*
  copy a member HDU of a grouping table to a new FITS file. The grouping table
  must be the CHDU of the FITS file pointed to by gfptr. The copy of the
  group member shall be appended to the end of the FITS file pointed to by
  mfptr. If the cpopt parameter is set to OPT_MCP_ADD then the copy of the 
  member is added to the grouping table as a new member, if OPT_MCP_NADD 
  then the copied member is not added to the grouping table, and if 
  OPT_MCP_REPL then the copied member is used to replace the original member.
  The copied member HDU also has its EXTVER value updated so that its
  combination of XTENSION, EXTNAME and EXVTER is unique within its new
  FITS file.
*/

{
  int numkeys = 0;
  int keypos  = 0;
  int hdunum  = 0;
  int hdutype = 0;
  int i;
  
  char *incList[] = {"GRPID#","GRPLC#"};
  char  extname[FLEN_VALUE];
  char  card[FLEN_CARD];
  char  comment[FLEN_COMMENT];
  char  keyname[FLEN_CARD];
  char  value[FLEN_CARD];

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* open the member HDU to be copied */

      *status = fits_open_member(gfptr,member,&tmpfptr,status);

      if(*status != 0) continue;

      /*
	if the member is a grouping table then copy it with a call to
	fits_copy_group() using the "copy only the grouping table" option

	if it is not a grouping table then copy the hdu with fits_copy_hdu()
	remove all GRPIDn and GRPLCn keywords, and update the EXTVER keyword
	value
      */

      /* get the member HDU's EXTNAME value */

      *status = fits_read_key_str(tmpfptr,"EXTNAME",extname,comment,status);

      /* if no EXTNAME value was found then set the extname to a null string */

      if(*status == KEY_NO_EXIST) 
	{
	  extname[0] = 0;
	  *status    = 0;
	}
      else if(*status != 0) continue;

      prepare_keyvalue(extname);

      /* if a grouping table then copy with fits_copy_group() */

      if(fits_strcasecmp(extname,"GROUPING") == 0)
	*status = fits_copy_group(tmpfptr,mfptr,OPT_GCP_GPT,status);
      else
	{
	  /* copy the non-grouping table HDU the conventional way */

	  *status = fits_copy_hdu(tmpfptr,mfptr,0,status);

	  ffgrec(mfptr,0,card,status);

	  /* delete all the GRPIDn and GRPLCn keywords in the copied HDU */

	  while(*status == 0)
	    {
	      *status = fits_find_nextkey(mfptr,incList,2,NULL,0,card,status);
	      *status = fits_get_hdrpos(mfptr,&numkeys,&keypos,status);  
	      /* SPR 1738 */
	      *status = fits_read_keyn(mfptr,keypos-1,keyname,value,
				       comment,status);
	      *status = fits_read_record(mfptr,keypos-1,card,status);
	      *status = fits_delete_key(mfptr,keyname,status);
	    }

	  if(*status == KEY_NO_EXIST) *status = 0;
	  if(*status != 0) continue;
	}

      /* 
	 if the member HDU does not have an EXTNAME keyword then add one
	 with a default value
      */

      if(strlen(extname) == 0)
	{
	  if(fits_get_hdu_num(tmpfptr,&hdunum) == 1)
	    {
	      strcpy(extname,"PRIMARY");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "HDU was Formerly a Primary Array",
					   status);
	    }
	  else
	    {
	      strcpy(extname,"DEFAULT");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "default EXTNAME set by CFITSIO",
					   status);
	    }
	}

      /* 
	 update the member HDU's EXTVER value (add it if not present)
      */

      fits_get_hdu_num(mfptr,&hdunum);
      fits_get_hdu_type(mfptr,&hdutype,status);

      /* set the EXTVER value to 0 for now */

      *status = fits_modify_key_lng(mfptr,"EXTVER",0,NULL,status);

      /* if the EXTVER keyword was not found then add it */

      if(*status == KEY_NO_EXIST)
	{
	  *status = 0;
	  *status = fits_read_key_str(mfptr,"EXTNAME",extname,comment,
				      status);
	  *status = fits_insert_key_lng(mfptr,"EXTVER",0,
					"Extension version ID",status);
	}

      if(*status != 0) continue;

      /* find the first available EXTVER value for the copied HDU */
 
      for(i = 1; fits_movnam_hdu(mfptr,hdutype,extname,i,status) == 0; ++i);

      *status = 0;

      fits_movabs_hdu(mfptr,hdunum,&hdutype,status);

      /* reset the copied member HDUs EXTVER value */

      *status = fits_modify_key_lng(mfptr,"EXTVER",(long)i,NULL,status);    

      /*
	perform member copy operations that are dependent upon the cpopt
	parameter value
      */

      switch(cpopt)
	{
	case OPT_MCP_ADD:

	  /*
	    add the copied member to the grouping table, leaving the
	    entry for the original member in place
	  */

	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	case OPT_MCP_NADD:

	  /*
	    nothing to do for this copy option
	  */

	  break;

	case OPT_MCP_REPL:

	  /*
	    remove the original member from the grouping table and add the
	    copied member in its place
	  */

	  *status = fits_remove_member(gfptr,member,OPT_RM_ENTRY,status);
	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the cmopt parameter (ffgmcp)");

	  break;
	}

    }while(0);
      
  if(tmpfptr != NULL) 
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}